

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void DumpGraph(RegVmLoweredModule *lowModule)

{
  InstructionRegVmLowerGraphContext instLowerGraphCtx;
  char tempBuf [4096];
  char outputBuf [4096];
  InstructionRegVmLowerGraphContext local_2280;
  OutputContext local_2258;
  char local_2018 [4096];
  char local_1018 [4104];
  
  local_2258.stream = (void *)0x0;
  local_2258.openStream = OutputContext::FileOpen;
  local_2258.writeStream = OutputContext::FileWrite;
  local_2258.closeStream = OutputContext::FileClose;
  local_2258.outputBufSize = 0x1000;
  local_2258.outputBufPos = 0;
  local_2258.outputBuf = local_1018;
  local_2258.tempBuf = local_2018;
  local_2258.tempBufSize = 0x1000;
  local_2258.stream = OutputContext::FileOpen("inst_graph_reg_low.txt");
  local_2280.output = &local_2258;
  local_2280.code = (char *)0x0;
  local_2258.writeStream = OutputContext::FileWrite;
  local_2280.lastStart = (char *)0x0;
  local_2280.lastStartOffset = 0;
  local_2280.lastEndOffset = 0;
  local_2280.showSource = true;
  local_2280.showAnnotatedSource = false;
  PrintGraph(&local_2280,lowModule);
  fclose((FILE *)local_2258.stream);
  local_2258.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_2258);
  return;
}

Assistant:

void DumpGraph(RegVmLoweredModule *lowModule)
{
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("inst_graph_reg_low.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	InstructionRegVmLowerGraphContext instLowerGraphCtx(outputCtx);

	instLowerGraphCtx.showSource = true;

	PrintGraph(instLowerGraphCtx, lowModule);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}